

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxSoundCast::Resolve(FxSoundCast *this,FCompileContext *ctx)

{
  int iVar1;
  undefined4 extraout_var;
  PClass *pPVar3;
  FxConstant *this_00;
  undefined1 local_38 [8];
  ExpVal constval;
  FSoundID local_1c;
  FxExpression *pFVar2;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->basex == (FxExpression *)0x0) {
LAB_00508a19:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  iVar1 = (*this->basex->_vptr_FxExpression[2])();
  pFVar2 = (FxExpression *)CONCAT44(extraout_var,iVar1);
  this->basex = pFVar2;
  if (pFVar2 == (FxExpression *)0x0) goto LAB_00508a19;
  if (pFVar2->ValueType != (PType *)TypeSound) {
    pPVar3 = DObject::GetClass((DObject *)pFVar2->ValueType);
    pFVar2 = this->basex;
    if (pPVar3 != PInt::RegistrationInfo.MyClass) {
      if (pFVar2->ValueType == (PType *)TypeString) {
        iVar1 = (*pFVar2->_vptr_FxExpression[3])(pFVar2);
        if ((char)iVar1 == '\0') {
          return &this->super_FxExpression;
        }
        pFVar2 = this->basex + 1;
        ExpVal::ExpVal(&constval,(ExpVal *)pFVar2);
        this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar2);
        ExpVal::GetString((ExpVal *)local_38);
        local_1c.ID = S_FindSound((char *)local_38);
        FxConstant::FxConstant(this_00,&local_1c,&(this->super_FxExpression).ScriptPosition);
        FString::~FString((FString *)local_38);
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        ExpVal::~ExpVal(&constval);
        return &this_00->super_FxExpression;
      }
      pFVar2 = (FxExpression *)0x0;
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Cannot convert to sound");
      goto LAB_00508a33;
    }
  }
  pFVar2->ValueType = (PType *)TypeSound;
  this->basex = (FxExpression *)0x0;
LAB_00508a33:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return pFVar2;
}

Assistant:

FxExpression *FxSoundCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeSound || basex->ValueType->GetClass() == RUNTIME_CLASS(PInt))
	{
		FxExpression *x = basex;
		x->ValueType = TypeSound;
		basex = nullptr;
		delete this;
		return x;
	}
	else if (basex->ValueType == TypeString)
	{
		if (basex->isConstant())
		{
			ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
			FxExpression *x = new FxConstant(FSoundID(constval.GetString()), ScriptPosition);
			delete this;
			return x;
		}
		return this;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Cannot convert to sound");
		delete this;
		return nullptr;
	}
}